

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O3

unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> __thiscall
flow::BasicBlock::replace
          (BasicBlock *this,Instr *oldInstr,
          unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *newInstr)

{
  pointer ppVVar1;
  Value *pVVar2;
  Instr *in_RAX;
  TerminateInstr *pTVar3;
  long lVar4;
  long *in_RCX;
  pointer ppVVar5;
  pointer ppVVar6;
  pointer *__ptr;
  ulong uVar7;
  _Head_base<0UL,_flow::Instr_*,_false> _Var8;
  _Head_base<0UL,_flow::Instr_*,_false> local_28;
  
  if (newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
      super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != oldInstr) {
    __assert_fail("oldInstr->getBasicBlock() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x56,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  if (((Value *)*in_RCX)[1]._vptr_Value != (_func_int **)0x0) {
    __assert_fail("newInstr->getBasicBlock() == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x57,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  local_28._M_head_impl = in_RAX;
  Value::replaceAllUsesWith((Value *)newInstr,(Value *)*in_RCX);
  pTVar3 = getTerminator((BasicBlock *)oldInstr);
  if (pTVar3 == (TerminateInstr *)newInstr) {
    remove(this,(char *)oldInstr);
    local_28._M_head_impl = (Instr *)*in_RCX;
    *in_RCX = 0;
    push_back((BasicBlock *)oldInstr,
              (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_28);
    _Var8._M_head_impl = local_28._M_head_impl;
    goto LAB_00141dc7;
  }
  if ((*in_RCX != 0) &&
     (lVar4 = __dynamic_cast(*in_RCX,&Instr::typeinfo,&TerminateInstr::typeinfo,0), lVar4 != 0)) {
    __assert_fail("dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && \"Most not be a terminator instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x60,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  ppVVar5 = (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)ppVVar1 - (long)ppVVar5;
  if (0 < (long)uVar7 >> 5) {
    ppVVar6 = (pointer)((long)ppVVar5 + (uVar7 & 0xffffffffffffffe0));
    lVar4 = ((long)uVar7 >> 5) + 1;
    ppVVar5 = ppVVar5 + 2;
    do {
      if (ppVVar5[-2] == (Value *)newInstr) {
        ppVVar5 = ppVVar5 + -2;
        goto LAB_00141d9f;
      }
      if (ppVVar5[-1] == (Value *)newInstr) {
        ppVVar5 = ppVVar5 + -1;
        goto LAB_00141d9f;
      }
      if (*ppVVar5 == (Value *)newInstr) goto LAB_00141d9f;
      if (ppVVar5[1] == (Value *)newInstr) {
        ppVVar5 = ppVVar5 + 1;
        goto LAB_00141d9f;
      }
      lVar4 = lVar4 + -1;
      ppVVar5 = ppVVar5 + 4;
    } while (1 < lVar4);
    uVar7 = (long)ppVVar1 - (long)ppVVar6;
    ppVVar5 = ppVVar6;
  }
  lVar4 = (long)uVar7 >> 3;
  if (lVar4 == 1) {
LAB_00141d83:
    if (*ppVVar5 != (Value *)newInstr) {
      ppVVar5 = ppVVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_00141d7a:
    if (*ppVVar5 != (Value *)newInstr) {
      ppVVar5 = ppVVar5 + 1;
      goto LAB_00141d83;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_00141e1f;
    if (*ppVVar5 != (Value *)newInstr) {
      ppVVar5 = ppVVar5 + 1;
      goto LAB_00141d7a;
    }
  }
LAB_00141d9f:
  if (ppVVar5 == ppVVar1) {
LAB_00141e1f:
    __assert_fail("i != code_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x66,
                  "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)"
                 );
  }
  newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
  super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
  super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
  *(Instr **)(*in_RCX + 0x48) = oldInstr;
  (this->super_Value)._vptr_Value = (_func_int **)*ppVVar5;
  *ppVVar5 = (Value *)0x0;
  pVVar2 = (Value *)*in_RCX;
  *in_RCX = 0;
  _Var8._M_head_impl = (Instr *)*ppVVar5;
  *ppVVar5 = pVVar2;
LAB_00141dc7:
  if (_Var8._M_head_impl != (Instr *)0x0) {
    (*((_Var8._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  return (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)
         (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Instr> BasicBlock::replace(Instr* oldInstr,
                                           std::unique_ptr<Instr> newInstr) {
  assert(oldInstr->getBasicBlock() == this);
  assert(newInstr->getBasicBlock() == nullptr);

  oldInstr->replaceAllUsesWith(newInstr.get());

  if (oldInstr == getTerminator()) {
    std::unique_ptr<Instr> removedInstr = remove(oldInstr);
    push_back(std::move(newInstr));
    return removedInstr;
  } else {
    assert(dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && "Most not be a terminator instruction.");

    auto i = std::find_if(
        code_.begin(), code_.end(),
        [&](const auto& obj) { return obj.get() == oldInstr; });

    assert(i != code_.end());

    oldInstr->setParent(nullptr);
    newInstr->setParent(this);

    std::unique_ptr<Instr> removedInstr = std::move(*i);
    *i = std::move(newInstr);
    return removedInstr;
  }
}